

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiple_load_store.c
# Opt level: O2

void multiple_load_store(arm7tdmi_t *state,thumbinstr_t *thminstr)

{
  uint32_t *puVar1;
  ushort uVar2;
  bool bVar3;
  uint32_t uVar4;
  uint uVar5;
  uint32_t *puVar6;
  access_type_t aVar7;
  uint32_t uVar8;
  uint uVar9;
  ulong uVar10;
  int i;
  uint32_t *puVar11;
  
  uVar2 = thminstr->raw;
  uVar5 = uVar2 >> 8 & 7;
  puVar1 = state->r;
  uVar8 = state->r[uVar5];
  if ((uVar2 & 0xff) == 0) {
    if ((uVar2 >> 0xb & 1) == 0) {
      (*state->write_word)(uVar8,state->pc + 2,ACCESS_NONSEQUENTIAL);
    }
    else {
      uVar4 = (*state->read_word)(uVar8,ACCESS_NONSEQUENTIAL);
      uVar5 = uVar4 | 1;
      if (2 < gba_log_verbosity) {
        printf("[DEBUG] Set r%d to 0x%08X\n",0xf,(ulong)uVar5);
      }
      if (((uint)state->cpsr & 0x20) == 0) {
        uVar5 = uVar4 & 0xfffffffe;
      }
      set_pc(state,uVar5);
    }
    uVar9 = uVar8 + 0x40;
  }
  else if ((uVar2 >> 0xb & 1) == 0) {
    bVar3 = true;
    aVar7 = ACCESS_NONSEQUENTIAL;
    uVar9 = uVar8;
    for (uVar10 = 0; uVar10 != 8; uVar10 = uVar10 + 1) {
      uVar5 = thminstr->raw & 0xff;
      if ((uVar5 >> ((uint)uVar10 & 0x1f) & 1) != 0) {
        if (uVar10 == (thminstr->raw >> 8 & 7)) {
          uVar4 = uVar8;
          if (!bVar3) {
            uVar4 = uVar8 + ((uVar5 * 0x8040201 >> 3 & 0x11111111) * 0x11111111 >> 0x1c) * 4;
          }
        }
        else {
          uVar4 = puVar1[uVar10];
        }
        (*state->write_word)(uVar9,uVar4,aVar7);
        uVar9 = uVar9 + 4;
        bVar3 = false;
        aVar7 = ACCESS_SEQUENTIAL;
      }
    }
  }
  else {
    aVar7 = ACCESS_NONSEQUENTIAL;
    puVar11 = puVar1;
    for (uVar10 = 0; uVar10 != 9; uVar10 = uVar10 + 1) {
      if ((*(byte *)thminstr & (byte)(1 << ((byte)uVar10 & 0x1f))) != 0) {
        uVar4 = (*state->read_word)(uVar8,aVar7);
        if (2 < gba_log_verbosity) {
          printf("[DEBUG] Set r%d to 0x%08X\n",uVar10 & 0xffffffff,(ulong)uVar4);
        }
        puVar6 = puVar11 + 5;
        if (((state->cpsr).raw & 0x1f) != 0x11) {
          puVar6 = puVar11;
        }
        if (4 < uVar10 - 8) {
          puVar6 = puVar11;
        }
        *puVar6 = uVar4;
        uVar8 = uVar8 + 4;
        aVar7 = ACCESS_SEQUENTIAL;
      }
      puVar11 = puVar11 + 1;
    }
    uVar9 = uVar8;
    if ((uVar2 & 0xff & 1 << (sbyte)uVar5) != 0) {
      return;
    }
  }
  uVar10 = (ulong)(*(byte *)((long)thminstr + 1) & 7);
  if (2 < gba_log_verbosity) {
    printf("[DEBUG] Set r%d to 0x%08X\n",uVar10,(ulong)uVar9);
  }
  puVar1[uVar10] = uVar9;
  return;
}

Assistant:

void multiple_load_store(arm7tdmi_t* state, thumbinstr_t* thminstr) {
    multiple_load_store_t* instr = &thminstr->MULTIPLE_LOAD_STORE;
    word address = get_register(state, instr->rb);
    word base = address;
    bool writeback = true;
    access_type_t access = ACCESS_NONSEQUENTIAL;
    if (instr->rlist == 0) { // When rlist 0, save and load the program counter instead
        if (instr->l) {
            set_register(state, REG_PC, state->read_word(address, ACCESS_NONSEQUENTIAL) | 1);
        } else {
            state->write_word(address, state->pc + 2, ACCESS_NONSEQUENTIAL);
        }
        address += 0x40;
    }
    else if (instr->l) {
        if (instr->rlist & (1 << instr->rb)) {
            writeback = false; // Don't writeback to rb when we're also transferring to rb
        }
        for (int i = 0; i <= 8; i++) {
            if ((instr->rlist >> i) & 1) {
                set_register(state, i, state->read_word(address, access));
                access = ACCESS_SEQUENTIAL;
                address += 4;
            }
        }
    } else {
        bool first = true;
        for (int i = 0; i < 8; i++) {
            if ((instr->rlist >> i) & 1) {
                word value;
                if (i == instr->rb) {
                    if (first) {
                        value = base;
                    } else {
                        value = base + 4 * popcount(instr->rlist);
                    }
                } else {
                    value = get_register(state, i);
                }

                state->write_word(address, value, access);
                access = ACCESS_SEQUENTIAL;
                first = false;
                address += 4;
            }
        }
    }

    if (writeback) {
        set_register(state, instr->rb, address);
    }
}